

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O2

int __thiscall
SID::clock_resample_fast(SID *this,cycle_count *delta_t,short *buf,int n,int interleave)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  short *psVar4;
  short sVar5;
  int i;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  
  uVar9 = this->sample_offset;
  iVar6 = 0;
  do {
    uVar9 = uVar9 + this->cycles_per_sample;
    iVar10 = (int)uVar9 >> 0x10;
    iVar1 = *delta_t;
    iVar11 = iVar6;
    if (iVar1 < iVar10) break;
    if (n <= iVar6) {
      return iVar6;
    }
    iVar11 = 0;
    if (0 < iVar10) {
      iVar11 = iVar10;
    }
    while (bVar12 = iVar11 != 0, iVar11 = iVar11 + -1, bVar12) {
      clock(this);
      iVar2 = (this->extfilt).Vo;
      sVar5 = (short)(iVar2 / 0xb);
      if (iVar2 < -0x5800a) {
        sVar5 = -0x8000;
      }
      if (0x57fff < iVar2) {
        sVar5 = 0x7fff;
      }
      psVar4 = this->sample;
      iVar2 = this->sample_index;
      psVar4[(long)iVar2 + 0x4000] = sVar5;
      psVar4[iVar2] = sVar5;
      this->sample_index = iVar2 + 1U & 0x3fff;
    }
    *delta_t = *delta_t - iVar10;
    uVar9 = uVar9 & 0xffff;
    this->sample_offset = uVar9;
    uVar3 = this->fir_N;
    uVar7 = 0;
    uVar8 = 0;
    if (0 < (int)uVar3) {
      uVar8 = (ulong)uVar3;
    }
    iVar11 = 0;
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      iVar11 = iVar11 + (int)this->fir[(long)(int)(((int)(this->fir_RES * uVar9) >> 0x10) * uVar3) +
                                       uVar7] *
                        (int)this->sample
                             [(long)this->sample_index + ((uVar7 + 0x4000) - (long)(int)uVar3)];
    }
    iVar11 = iVar11 >> 0xf;
    if (iVar11 < -0x7fff) {
      iVar11 = -0x8000;
    }
    sVar5 = (short)iVar11;
    if (0x7ffe < iVar11) {
      sVar5 = 0x7fff;
    }
    iVar11 = iVar6 + 1;
    buf[iVar6 * interleave] = sVar5;
    iVar6 = iVar11;
  } while (iVar10 <= iVar1);
  for (iVar6 = 0; iVar6 < *delta_t; iVar6 = iVar6 + 1) {
    clock(this);
    iVar1 = (this->extfilt).Vo;
    sVar5 = (short)(iVar1 / 0xb);
    if (iVar1 < -0x5800a) {
      sVar5 = -0x8000;
    }
    if (0x57fff < iVar1) {
      sVar5 = 0x7fff;
    }
    psVar4 = this->sample;
    iVar1 = this->sample_index;
    psVar4[(long)iVar1 + 0x4000] = sVar5;
    psVar4[iVar1] = sVar5;
    this->sample_index = iVar1 + 1U & 0x3fff;
  }
  this->sample_offset = this->sample_offset + *delta_t * -0x10000;
  *delta_t = 0;
  return iVar11;
}

Assistant:

RESID_INLINE
int SID::clock_resample_fast(cycle_count& delta_t, short* buf, int n,
			     int interleave)
{
  int s = 0;

  for (;;) {
    cycle_count next_sample_offset = sample_offset + cycles_per_sample;
    cycle_count delta_t_sample = next_sample_offset >> FIXP_SHIFT;
    if (delta_t_sample > delta_t) {
      break;
    }
    if (s >= n) {
      return s;
    }
    for (int i = 0; i < delta_t_sample; i++) {
      clock();
      sample[sample_index] = sample[sample_index + RINGSIZE] = output();
      ++sample_index;
      sample_index &= 0x3fff;
    }
    delta_t -= delta_t_sample;
    sample_offset = next_sample_offset & FIXP_MASK;

    int fir_offset = sample_offset*fir_RES >> FIXP_SHIFT;
    short* fir_start = fir + fir_offset*fir_N;
    short* sample_start = sample + sample_index - fir_N + RINGSIZE;

    // Convolution with filter impulse response.
    int v = 0;
    for (int j = 0; j < fir_N; j++) {
      v += sample_start[j]*fir_start[j];
    }

    v >>= FIR_SHIFT;

    // Saturated arithmetics to guard against 16 bit sample overflow.
    const int half = 1 << 15;
    if (v >= half) {
      v = half - 1;
    }
    else if (v < -half) {
      v = -half;
    }

    buf[s++*interleave] = v;
  }

  for (int i = 0; i < delta_t; i++) {
    clock();
    sample[sample_index] = sample[sample_index + RINGSIZE] = output();
    ++sample_index;
    sample_index &= 0x3fff;
  }
  sample_offset -= delta_t << FIXP_SHIFT;
  delta_t = 0;
  return s;
}